

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O0

int __thiscall
CVmObjVector::add_val(CVmObjVector *this,vm_val_t *result,vm_obj_id_t self,vm_val_t *val)

{
  int iVar1;
  vm_obj_id_t obj;
  size_t sVar2;
  char *__dest;
  char *__src;
  vm_val_t *in_RCX;
  vm_val_t *in_RSI;
  vm_val_t *in_RDI;
  vm_val_t ele;
  CVmObjVector *new_vec;
  int i;
  int alo_cnt;
  int rhs_cnt;
  int idx;
  size_t in_stack_ffffffffffffff88;
  vm_val_t *this_00;
  vm_val_t *in_stack_ffffffffffffff98;
  vm_val_t *in_stack_ffffffffffffffa0;
  int iVar3;
  int iVar4;
  int local_30;
  
  CVmStack::push(in_RCX);
  sVar2 = get_element_count((CVmObjVector *)0x34f115);
  iVar1 = vm_val_t::is_listlike(in_stack_ffffffffffffffa0);
  if (iVar1 == 0) {
    iVar1 = -1;
  }
  else {
    iVar1 = vm_val_t::ll_length(in_stack_ffffffffffffff98);
  }
  iVar3 = iVar1;
  if (iVar1 < 0) {
    iVar3 = 1;
  }
  this_00 = in_RSI;
  iVar4 = iVar1;
  obj = create((int)((ulong)in_RSI >> 0x20),in_stack_ffffffffffffff88);
  vm_val_t::set_obj(this_00,obj);
  vm_objp(0);
  CVmStack::push(in_RSI);
  __dest = get_element_ptr((CVmObjVector *)this_00,in_stack_ffffffffffffff88);
  __src = get_element_ptr((CVmObjVector *)this_00,in_stack_ffffffffffffff88);
  sVar2 = calc_alloc_ele((long)(int)sVar2);
  memcpy(__dest,__src,sVar2);
  set_element_count((CVmObjVector *)this_00,in_stack_ffffffffffffff88);
  if (iVar1 < 0) {
    set_element((CVmObjVector *)this_00,in_stack_ffffffffffffff88,(vm_val_t *)0x34f21d);
    set_element_count((CVmObjVector *)this_00,in_stack_ffffffffffffff88);
  }
  else {
    for (local_30 = 1; local_30 <= iVar1; local_30 = local_30 + 1) {
      vm_val_t::ll_index(in_RDI,(vm_val_t *)CONCAT44(iVar4,iVar3),(int)((ulong)__src >> 0x20));
      set_element((CVmObjVector *)this_00,in_stack_ffffffffffffff88,(vm_val_t *)0x34f26c);
      set_element_count((CVmObjVector *)this_00,in_stack_ffffffffffffff88);
    }
  }
  CVmStack::discard(2);
  return 1;
}

Assistant:

int CVmObjVector::add_val(VMG_ vm_val_t *result,
                          vm_obj_id_t self, const vm_val_t *val)
{
    int idx;
    int rhs_cnt, alo_cnt;
    int i;
    CVmObjVector *new_vec;

    /* push the value to append, for gc protection */
    G_stk->push(val);

    /* 
     *   remember the index of the first new element - this is simply one
     *   higher than the last valid current index 
     */
    idx = get_element_count();

    /* get the number of elements to add */
    rhs_cnt = (val->is_listlike(vmg0_) ? val->ll_length(vmg0_) : -1);

    /* if it's not list-like, just add it directly as a single element */
    alo_cnt = (rhs_cnt < 0 ? 1 : rhs_cnt);

    /* 
     *   allocate a copy of the vector for the result - make it big enough
     *   for my elements plus the elements to be appended 
     */
    result->set_obj(create(vmg_ FALSE, idx + alo_cnt));

    /* get the return value as a vector */
    new_vec = (CVmObjVector *)vm_objp(vmg_ result->val.obj);

    /* push the result for gc protection */
    G_stk->push(result);

    /* copy my elements into the result */
    memcpy(new_vec->get_element_ptr(0), get_element_ptr(0),
           calc_alloc_ele(idx));

    /* 
     *   set the element count to include the elements copied so far (it's a
     *   new vector, so there's no need to save undo) 
     */
    new_vec->set_element_count(idx);

    /* add the new element or elements */
    if (rhs_cnt < 0)
    {
        /* add a single element */
        new_vec->set_element(idx, val);
        new_vec->set_element_count(idx + 1);
    }
    else
    {
        /* add the contents of the rhs */
        for (i = 1 ; i <= rhs_cnt ; ++i, ++idx)
        {
            /* get this element from the right-hand side */
            vm_val_t ele;
            val->ll_index(vmg_ &ele, i);
            
            /* store the element in the result */
            new_vec->set_element(idx, &ele);
            new_vec->set_element_count(idx + 1);
        }
    }

    /* discard the gc protect */
    G_stk->discard(2);

    /* handled */
    return TRUE;
}